

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O3

void __thiscall lr_grammar::GrammarLR::GrammarLR(GrammarLR *this,string *generate,int length)

{
  _Rb_tree_header *p_Var1;
  vector<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_> *pvVar2;
  int iVar3;
  long lVar4;
  pointer pcVar5;
  pointer pvVar6;
  vector<int,_std::allocator<int>_> *this_00;
  iterator __position;
  int iVar7;
  pointer pvVar8;
  long *plVar9;
  ostream *poVar10;
  pointer piVar11;
  int *piVar12;
  pointer pDVar13;
  pointer pEVar14;
  pointer pvVar15;
  pointer pbVar16;
  ulong uVar17;
  long *plVar18;
  pointer pEVar19;
  pointer pEVar20;
  pointer pPVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  char *pcVar25;
  Express *this_01;
  long lVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  string text;
  string name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result_of_name;
  string finnalyC;
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  vectorGenrates;
  char buffer [8];
  vector<int,_std::allocator<int>_> exp;
  undefined1 *local_2b8;
  undefined8 local_2b0;
  undefined1 local_2a8 [16];
  long *local_298;
  long local_290;
  long local_288;
  long lStack_280;
  undefined1 local_278 [32];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_258;
  vector<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_> *local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  ulong local_228;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_220;
  char *local_218;
  long local_210;
  char local_208 [16];
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_1f8;
  ulong local_1d8;
  vector<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
  *local_1d0;
  ulong local_1c8;
  string local_1c0;
  char local_1a0 [8];
  undefined1 *local_198 [2];
  undefined1 local_188 [16];
  string local_178;
  vector<int,_std::allocator<int>_> local_158;
  Express local_140;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  Express local_48;
  
  p_Var1 = &(this->name_of_keys)._M_t._M_impl.super__Rb_tree_header;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pvVar2 = &this->elements;
  local_220 = &this->first;
  local_258 = &this->follow;
  local_250 = &this->states;
  local_1d0 = &this->action_table;
  memset(&(this->name_of_keys)._M_t._M_impl.super__Rb_tree_header._M_node_count,0,200);
  local_1f8.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if (0 < length) {
    local_1d8 = (ulong)(uint)length;
    lVar26 = local_1d8 << 5;
    lVar22 = 0;
    do {
      local_278._0_8_ = (pointer)0x0;
      local_278._8_8_ = (pointer)0x0;
      local_278._16_8_ = (pointer)0x0;
      lVar4 = *(long *)((long)&(generate->_M_dataplus)._M_p + lVar22);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,lVar4,
                 *(long *)((long)&generate->_M_string_length + lVar22) + lVar4);
      public_tool::parse_productions
                (&local_68,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_278);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      std::
      vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::push_back(&local_1f8,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_278);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_278);
      lVar22 = lVar22 + 0x20;
    } while (lVar26 != lVar22);
    if (0 < length) {
      lVar22 = local_1d8 * 0x18;
      lVar26 = 0;
      do {
        plVar9 = *(long **)((long)&((local_1f8.
                                     super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   )._M_impl.super__Vector_impl_data._M_start + lVar26);
        lVar4 = *plVar9;
        local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
        std::__cxx11::string::_M_construct<char*>((string *)&local_88,lVar4,plVar9[1] + lVar4);
        add_elem(this,&local_88,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        lVar26 = lVar26 + 0x18;
      } while (lVar22 != lVar26);
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (0 < length) {
        uVar17 = 0;
        pvVar8 = local_1f8.
                 super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pbVar16 = pvVar8[uVar17].
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_1c8 = uVar17;
          if (0x20 < (ulong)((long)pvVar8[uVar17].
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar16)) {
            uVar24 = 1;
            do {
              pcVar5 = pbVar16[uVar24]._M_dataplus._M_p;
              local_228 = uVar24;
              local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_178,pcVar5,pcVar5 + pbVar16[uVar24]._M_string_length);
              public_tool::parse_elem(&local_178,&local_248);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                operator_delete(local_178._M_dataplus._M_p);
              }
              local_278._0_8_ = (pointer)0x0;
              local_278._8_8_ = (pointer)0x0;
              local_278._16_8_ = (pointer)0x0;
              if (local_248.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish !=
                  local_248.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                lVar22 = 8;
                uVar24 = 0;
                do {
                  lVar26 = *(long *)((long)local_248.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar22 + -8);
                  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_a8,lVar26,
                             *(long *)((long)&((local_248.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start)->
                                              _M_dataplus)._M_p + lVar22) + lVar26);
                  iVar7 = find_name(this,&local_a8);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
                    operator_delete(local_a8._M_dataplus._M_p);
                  }
                  local_218 = (char *)CONCAT44(local_218._4_4_,iVar7);
                  if (iVar7 == -2) {
                    local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
                    lVar26 = *(long *)((long)local_248.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar22 + -8
                                      );
                    std::__cxx11::string::_M_construct<char*>
                              ((string *)&local_1c0,lVar26,
                               *(long *)((long)&((local_248.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                _M_dataplus)._M_p + lVar22) + lVar26);
                    iVar7 = add_elem(this,&local_1c0,true);
                    local_218 = (char *)CONCAT44(local_218._4_4_,iVar7);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
                      operator_delete(local_1c0._M_dataplus._M_p);
                    }
                  }
                  if (local_278._8_8_ == local_278._16_8_) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)local_278,
                               (iterator)local_278._8_8_,(int *)&local_218);
                  }
                  else {
                    *(int *)local_278._8_8_ = (int)local_218;
                    local_278._8_8_ = local_278._8_8_ + 4;
                  }
                  uVar24 = uVar24 + 1;
                  lVar22 = lVar22 + 0x20;
                } while (uVar24 < (ulong)((long)local_248.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                          (long)local_248.
                                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_impl.super__Vector_impl_data._M_start >> 5));
              }
              pbVar16 = local_1f8.
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar17].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pcVar5 = (pbVar16->_M_dataplus)._M_p;
              local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_c8,pcVar5,pcVar5 + pbVar16->_M_string_length);
              iVar7 = find_name(this,&local_c8);
              pEVar14 = (pvVar2->
                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              base_grammar::Express::Express
                        (&local_48,(vector<int,_std::allocator<int>_> *)local_278);
              std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
                        (&pEVar14[iVar7].expression_of_set,(value_type *)&local_48);
              if (local_48.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_48.expression.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
                operator_delete(local_c8._M_dataplus._M_p);
              }
              if ((pointer)local_278._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_278._0_8_);
              }
              uVar24 = local_228 + 1;
              pbVar16 = local_1f8.
                        super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar17].
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              pvVar8 = local_1f8.
                       super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            } while (uVar24 < (ulong)((long)local_1f8.
                                            super__Vector_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar17].
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                      (long)pbVar16 >> 5));
          }
          uVar17 = local_1c8 + 1;
        } while (uVar17 != local_1d8);
      }
      goto LAB_00109b69;
    }
  }
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_00109b69:
  local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"#","");
  add_elem(this,&local_e8,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  pEVar14 = (pvVar2->
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>).
            _M_impl.super__Vector_impl_data._M_start;
  local_278._0_8_ = local_278 + 0x10;
  pcVar5 = (pEVar14->super_Elem).name._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_278,pcVar5,pcVar5 + (pEVar14->super_Elem).name._M_string_length);
  std::__cxx11::string::append(local_278);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,local_278._0_8_,
             (undefined1 *)
             ((long)&((_Alloc_hider *)local_278._8_8_)->_M_p +
             (long)&((_Alloc_hider *)local_278._0_8_)->_M_p));
  iVar7 = add_elem(this,&local_108,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_218 = (char *)((ulong)local_218 & 0xffffffff00000000);
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_158,(iterator)0x0,(int *)&local_218);
  pEVar14 = (pvVar2->
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>).
            _M_impl.super__Vector_impl_data._M_start;
  base_grammar::Express::Express(&local_140,&local_158);
  std::vector<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>::push_back
            (&pEVar14[iVar7].expression_of_set,(value_type *)&local_140);
  if (local_140.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_140.expression.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  local_218 = local_208;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"finnaly:","");
  pEVar14 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->elements).
      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar14) {
    uVar17 = 0;
    do {
      if (pEVar14[uVar17].super_Elem.is_finally == false) {
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pEVar14[uVar17].super_Elem.name._M_dataplus._M_p,
                             pEVar14[uVar17].super_Elem.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"->",2);
        pEVar14 = (pvVar2->
                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        pEVar19 = pEVar14[uVar17].expression_of_set.
                  super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        if (*(pointer *)
             ((long)&pEVar14[uVar17].expression_of_set.
                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                     ._M_impl + 8) != pEVar19) {
          uVar24 = 0;
          do {
            piVar11 = *(pointer *)
                       &pEVar19[uVar24].super_Express.expression.
                        super__Vector_base<int,_std::allocator<int>_>;
            if (*(pointer *)
                 ((long)&pEVar19[uVar24].super_Express.expression.
                         super__Vector_base<int,_std::allocator<int>_> + 8) != piVar11) {
              uVar23 = 0;
              do {
                lVar22 = (long)piVar11[uVar23];
                if (lVar22 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"@",1);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pEVar14[lVar22].super_Elem.name._M_dataplus._M_p,
                             pEVar14[lVar22].super_Elem.name._M_string_length);
                }
                uVar23 = uVar23 + 1;
                pEVar14 = (pvVar2->
                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                lVar22 = *(long *)&pEVar14[uVar17].expression_of_set.
                                   super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                   ._M_impl.super__Vector_impl_data;
                piVar11 = *(pointer *)(lVar22 + uVar24 * 0x18);
              } while (uVar23 < (ulong)(*(long *)(lVar22 + 8 + uVar24 * 0x18) - (long)piVar11 >> 2))
              ;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," | ",3);
            uVar24 = uVar24 + 1;
            pEVar14 = (pvVar2->
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            pEVar19 = pEVar14[uVar17].expression_of_set.
                      super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            uVar23 = ((long)*(pointer *)
                             ((long)&pEVar14[uVar17].expression_of_set.
                                     super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                     ._M_impl + 8) - (long)pEVar19 >> 3) * -0x5555555555555555;
          } while (uVar24 <= uVar23 && uVar23 - uVar24 != 0);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
        std::ostream::put('(');
        std::ostream::flush();
      }
      else {
        local_2b8 = local_2a8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2b8,local_218,local_218 + local_210);
        std::__cxx11::string::append((char *)&local_2b8);
        plVar9 = (long *)std::__cxx11::string::_M_append
                                   ((char *)&local_2b8,
                                    (ulong)(pvVar2->
                                           super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                           )._M_impl.super__Vector_impl_data._M_start[uVar17].
                                           super_Elem.name._M_dataplus._M_p);
        plVar18 = plVar9 + 2;
        if ((long *)*plVar9 == plVar18) {
          local_288 = *plVar18;
          lStack_280 = plVar9[3];
          local_298 = &local_288;
        }
        else {
          local_288 = *plVar18;
          local_298 = (long *)*plVar9;
        }
        local_290 = plVar9[1];
        *plVar9 = (long)plVar18;
        plVar9[1] = 0;
        *(undefined1 *)(plVar9 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_218,(string *)&local_298);
        if (local_298 != &local_288) {
          operator_delete(local_298);
        }
        if (local_2b8 != local_2a8) {
          operator_delete(local_2b8);
        }
      }
      uVar17 = uVar17 + 1;
      pEVar14 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar24 = ((long)(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar14 >> 3) *
               -0x71c71c71c71c71c7;
    } while (uVar17 <= uVar24 && uVar24 - uVar17 != 0);
  }
  poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,local_218,local_210);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar10 + -0x18) + (char)poVar10);
  std::ostream::put((char)poVar10);
  std::ostream::flush();
  get_tow_char_index(this);
  create_first_set(this);
  if ((this->elements).
      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->elements).
      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar17 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"first[",6);
      pEVar14 = (pvVar2->
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>).
                _M_impl.super__Vector_impl_data._M_start;
      poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pEVar14[uVar17].super_Elem.name._M_dataplus._M_p,
                           pEVar14[uVar17].super_Elem.name._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]={",3);
      pvVar6 = (local_220->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      piVar11 = pvVar6[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar6[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 8) != piVar11) {
        uVar24 = 0;
        do {
          lVar22 = (long)piVar11[uVar24];
          if (lVar22 == -1) {
            lVar22 = 2;
            poVar10 = (ostream *)&std::cout;
            pcVar25 = "@ ";
          }
          else {
            pEVar14 = (pvVar2->
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,
                                 pEVar14[lVar22].super_Elem.name._M_dataplus._M_p,
                                 pEVar14[lVar22].super_Elem.name._M_string_length);
            lVar22 = 1;
            pcVar25 = " ";
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar25,lVar22);
          uVar24 = uVar24 + 1;
          pvVar6 = (local_220->
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          piVar11 = pvVar6[uVar17].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar24 < (ulong)((long)*(pointer *)
                                         ((long)&pvVar6[uVar17].
                                                 super__Vector_base<int,_std::allocator<int>_>.
                                                 _M_impl.super__Vector_impl_data + 8) -
                                  (long)piVar11 >> 2));
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
      uVar17 = uVar17 + 1;
      uVar24 = ((long)(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7;
    } while (uVar17 <= uVar24 && uVar24 - uVar17 != 0);
  }
  this_00 = (local_258->
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"#","");
  iVar7 = find_name(this,&local_128);
  local_298 = (long *)CONCAT44(local_298._4_4_,iVar7);
  __position._M_current =
       (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__position._M_current ==
      (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (this_00,__position,(int *)&local_298);
  }
  else {
    *__position._M_current = iVar7;
    (this_00->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
    _M_finish = __position._M_current + 1;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  create_follow_set(this);
  pEVar14 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  pEVar20 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (pEVar20 != pEVar14) {
    uVar17 = 0;
    do {
      if (pEVar14[uVar17].super_Elem.is_finally == false) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"follow[",7);
        pEVar14 = (pvVar2->
                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>)
                  ._M_impl.super__Vector_impl_data._M_start;
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,pEVar14[uVar17].super_Elem.name._M_dataplus._M_p,
                             pEVar14[uVar17].super_Elem.name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]={",3);
        pvVar6 = (local_258->
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        piVar11 = *(pointer *)&pvVar6[uVar17].super__Vector_base<int,_std::allocator<int>_>;
        if (*(pointer *)((long)(pvVar6 + uVar17) + 8) != piVar11) {
          uVar24 = 0;
          do {
            lVar22 = (long)piVar11[uVar24];
            if (lVar22 == -1) {
              lVar22 = 2;
              poVar10 = (ostream *)&std::cout;
              pcVar25 = "@ ";
            }
            else {
              pEVar14 = (pvVar2->
                        super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                        )._M_impl.super__Vector_impl_data._M_start;
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cout,
                                   pEVar14[lVar22].super_Elem.name._M_dataplus._M_p,
                                   pEVar14[lVar22].super_Elem.name._M_string_length);
              lVar22 = 1;
              pcVar25 = " ";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar25,lVar22);
            uVar24 = uVar24 + 1;
            pvVar6 = (local_258->
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            piVar11 = *(pointer *)&pvVar6[uVar17].super__Vector_base<int,_std::allocator<int>_>;
          } while (uVar24 < (ulong)((long)*(pointer *)((long)(pvVar6 + uVar17) + 8) - (long)piVar11
                                   >> 2));
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"}\n",2);
        pEVar14 = (this->elements).
                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pEVar20 = (this->elements).
                  super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      uVar17 = uVar17 + 1;
      uVar24 = ((long)pEVar20 - (long)pEVar14 >> 3) * -0x71c71c71c71c71c7;
    } while (uVar17 <= uVar24 && uVar24 - uVar17 != 0);
  }
  create_dfa_states(this);
  pDVar13 = (this->states).
            super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->states).super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
      ._M_impl.super__Vector_impl_data._M_finish != pDVar13) {
    uVar17 = 0;
    do {
      pPVar21 = pDVar13[uVar17].projects.
                super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_228 = uVar17;
      if (pDVar13[uVar17].projects.
          super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>._M_impl.
          super__Vector_impl_data._M_finish != pPVar21) {
        uVar24 = 0;
        do {
          iVar7 = pPVar21[uVar24].elemKey;
          lVar26 = (long)pPVar21[uVar24].expressIndex;
          iVar3 = pPVar21[uVar24].projectPoint;
          pEVar14 = (pvVar2->
                    super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,pEVar14[iVar7].super_Elem.name._M_dataplus._M_p
                               ,pEVar14[iVar7].super_Elem.name._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"->",2);
          lVar22 = *(long *)&(pvVar2->
                             super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                             )._M_impl.super__Vector_impl_data._M_start[iVar7].expression_of_set.
                             super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                             ._M_impl.super__Vector_impl_data;
          if (*(long *)(lVar22 + 8 + lVar26 * 0x18) != *(long *)(lVar22 + lVar26 * 0x18)) {
            this_01 = (Express *)(lVar22 + lVar26 * 0x18);
            uVar23 = 0;
            do {
              piVar12 = base_grammar::Express::operator[](this_01,(int)uVar23);
              if (*piVar12 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"@",1);
              }
              else {
                piVar12 = base_grammar::Express::operator[]
                                    ((Express *)
                                     (lVar26 * 0x18 +
                                     *(long *)&(pvVar2->
                                               super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                               )._M_impl.super__Vector_impl_data._M_start[iVar7].
                                               expression_of_set.
                                               super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                               ._M_impl.super__Vector_impl_data),(int)uVar23);
                pEVar14 = (pvVar2->
                          super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                          )._M_impl.super__Vector_impl_data._M_start;
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,pEVar14[*piVar12].super_Elem.name._M_dataplus._M_p,
                           pEVar14[*piVar12].super_Elem.name._M_string_length);
              }
              uVar23 = uVar23 + 1;
              this_01 = (Express *)
                        (*(long *)&(pvVar2->
                                   super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar7].
                                   expression_of_set.
                                   super__Vector_base<lr_grammar::ExpressLR,_std::allocator<lr_grammar::ExpressLR>_>
                                   ._M_impl.super__Vector_impl_data + lVar26 * 0x18);
            } while (uVar23 < (ulong)((long)(this_01->expression).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_finish -
                                      (long)(this_01->expression).
                                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                            super__Vector_impl_data._M_start >> 2));
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  ProjectPoint:",0xf);
          plVar9 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar3);
          std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
          std::ostream::put((char)plVar9);
          std::ostream::flush();
          uVar24 = uVar24 + 1;
          pDVar13 = (local_250->
                    super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>)
                    ._M_impl.super__Vector_impl_data._M_start;
          pPVar21 = pDVar13[uVar17].projects.
                    super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar23 = ((long)pDVar13[uVar17].projects.
                          super__Vector_base<lr_grammar::Project,_std::allocator<lr_grammar::Project>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar21 >> 2) *
                   -0x5555555555555555;
        } while (uVar24 <= uVar23 && uVar23 - uVar24 != 0);
      }
      if (0 < pDVar13[uVar17].elementCount) {
        lVar22 = 4;
        lVar26 = 0;
        do {
          if (pDVar13[uVar17].next[lVar26] != -1) {
            pEVar14 = (pvVar2->
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      )._M_impl.super__Vector_impl_data._M_start;
            poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,*(char **)((long)pEVar14 + lVar22 * 4 + -8),
                                 *(long *)(&(pEVar14->super_Elem).key + lVar22));
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"--",2);
            poVar10 = (ostream *)
                      std::ostream::operator<<
                                (poVar10,(*(int **)((long)((local_250->
                                                                                                                      
                                                  super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                                                  )._M_impl.super__Vector_impl_data._M_start +
                                                  uVar17) + 0x18))[lVar26]);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,"  ",2);
            pDVar13 = (local_250->
                      super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
          lVar26 = lVar26 + 1;
          lVar22 = lVar22 + 0x12;
        } while (lVar26 < pDVar13[uVar17].elementCount);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '(');
      std::ostream::put('(');
      std::ostream::flush();
      uVar17 = local_228 + 1;
      pDVar13 = (this->states).
                super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar24 = ((long)(this->states).
                      super__Vector_base<lr_grammar::DFAState,_std::allocator<lr_grammar::DFAState>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar13 >> 3) *
               -0x3333333333333333;
    } while (uVar17 <= uVar24 && uVar24 - uVar17 != 0);
  }
  create_action_table(this);
  local_298 = &local_288;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_298,"");
  pEVar14 = (this->elements).
            super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((this->elements).
      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar14) {
    lVar22 = 8;
    uVar17 = 0;
    do {
      sprintf(local_1a0,"%+7s",*(undefined8 *)((long)&(pEVar14->super_Elem).key + lVar22));
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_298,(long)local_298 + local_290);
      std::__cxx11::string::append((char *)&local_2b8);
      std::__cxx11::string::operator=((string *)&local_298,(string *)&local_2b8);
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8);
      }
      uVar17 = uVar17 + 1;
      pEVar14 = (this->elements).
                super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
                _M_impl.super__Vector_impl_data._M_start;
      uVar24 = ((long)(this->elements).
                      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar14 >> 3) *
               -0x71c71c71c71c71c7;
      lVar22 = lVar22 + 0x48;
    } while (uVar17 <= uVar24 && uVar24 - uVar17 != 0);
  }
  local_2b8 = local_2a8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2b8,local_298,(long)local_298 + local_290);
  std::__cxx11::string::append((char *)&local_2b8);
  std::__cxx11::string::operator=((string *)&local_298,(string *)&local_2b8);
  if (local_2b8 != local_2a8) {
    operator_delete(local_2b8);
  }
  pvVar15 = (this->action_table).
            super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->action_table).
      super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar15) {
    uVar17 = 0;
    do {
      if (pvVar15[uVar17].
          super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          pvVar15[uVar17].
          super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>._M_impl.
          super__Vector_impl_data._M_start) {
        pvVar15 = pvVar15 + uVar17;
        lVar22 = 0;
        uVar24 = 0;
        do {
          local_2b8 = local_2a8;
          local_2b0 = 0;
          local_2a8[0] = 0;
          uVar23 = (ulong)*(uint *)((long)&((pvVar15->
                                            super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                                            )._M_impl.super__Vector_impl_data._M_start)->type +
                                   lVar22);
          if (uVar23 < 4) {
            std::__cxx11::string::_M_replace
                      ((ulong)&local_2b8,0,(char *)0x0,
                       (ulong)(&DAT_001112a8 + *(int *)(&DAT_001112a8 + uVar23 * 4)));
          }
          sprintf(local_1a0,"%+7s",local_2b8);
          local_198[0] = local_188;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_198,local_298,(long)local_298 + local_290);
          std::__cxx11::string::append((char *)local_198);
          std::__cxx11::string::operator=((string *)&local_298,(string *)local_198);
          if (local_198[0] != local_188) {
            operator_delete(local_198[0]);
          }
          if (local_2b8 != local_2a8) {
            operator_delete(local_2b8);
          }
          uVar24 = uVar24 + 1;
          pvVar15 = (local_1d0->
                    super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start + uVar17;
          uVar23 = ((long)(pvVar15->
                          super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                          )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar15->
                          super__Vector_base<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>
                          )._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
          lVar22 = lVar22 + 0xc;
        } while (uVar24 <= uVar23 && uVar23 - uVar24 != 0);
      }
      local_2b8 = local_2a8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_2b8,local_298,(long)local_298 + local_290);
      std::__cxx11::string::append((char *)&local_2b8);
      std::__cxx11::string::operator=((string *)&local_298,(string *)&local_2b8);
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8);
      }
      uVar17 = uVar17 + 1;
      pvVar15 = (this->action_table).
                super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar24 = ((long)(this->action_table).
                      super__Vector_base<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>,_std::allocator<std::vector<lr_grammar::Action,_std::allocator<lr_grammar::Action>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar15 >> 3) *
               -0x5555555555555555;
    } while (uVar17 <= uVar24 && uVar24 - uVar17 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,(char *)local_298,local_290);
  if (local_298 != &local_288) {
    operator_delete(local_298);
  }
  if (local_218 != local_208) {
    operator_delete(local_218);
  }
  if (local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((pointer)local_278._0_8_ != (pointer)(local_278 + 0x10)) {
    operator_delete((void *)local_278._0_8_);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  std::
  vector<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~vector(&local_1f8);
  return;
}

Assistant:

GrammarLR::GrammarLR(string* generate, int length){

    //1.解析所有字符串
    vector<vector<string>> vectorGenrates;//这个是用来存放各个表达式

    //解析各个表达式,第一个是非终结符号，后面的是产生式
    for (int i = 0; i < length; i++){
        vector<string> temp;
        parse_productions(generate[i], temp);
        vectorGenrates.push_back(temp);
    }



    //2.添加非终结符添加到find表中,开始的非终结符就是length个
    for (int i = 0; i < length; i++){
        add_elem(vectorGenrates[i][0], false);
    }

    //3.一个个解析产生式,会添加到find表中
    vector<string> result_of_name;
    for (int i = 0; i < length; i++){

        //ElemLeft N_F_E = elements[find_name(vectorGenrates[i][0])];//非终结符，接下来要对这个终结符进行exp的添加

        //对genrates[i]进行分析；
        for (int j = 1; j < vectorGenrates[i].size(); j++){
            parse_elem(vectorGenrates[i][j], result_of_name);
            vector<int> exp;
            for (int m = 0; m < result_of_name.size(); m++){
                int index = find_name(result_of_name[m]);
                if (index == -2){
                    index = add_elem(result_of_name[m], true);
                }
                exp.push_back(index);

            }
            elements[find_name(vectorGenrates[i][0])].add_expression(ExpressLR(exp));
        }
    }

    add_elem("#", true);
    //添加拓广文法
    string name = elements[0].name + "'";
    int index = this->add_elem(name, false);
    vector<int> exp;
    exp.push_back(0);
    elements[index].add_expression(exp);

    //查看输入是不正确
    //测试一下：
    string finnalyC = "finnaly:";
    for (int i = 0; i < elements.size(); i++){
        if (!elements[i].is_finally){
            cout << elements[i].name << "->";
            for (int j = 0; j < elements[i].expression_of_set.size(); j++){
                for (int m = 0; m < elements[i].expression_of_set[j].expression.size(); m++){
                    if (elements[i].expression_of_set[j].expression[m] != -1){
                        cout << elements[elements[i].expression_of_set[j].expression[m]].name;
                    }
                    else
                    {
                        cout << "@";
                    }
                }
                cout << " | ";
            }
            cout << endl;
        }
        else
        {
            finnalyC = finnalyC + " " + elements[i].name;
        }
    }
    cout << finnalyC << endl;

    //6.两表生成（在5的时候就不会再添加新的符号了）
    //同时在这里初始化一下First和Follw表
    get_tow_char_index();

    //7.求first集合
    this->create_first_set();

    //检查一下，first集合
    for (int i = 0; i < elements.size(); i++){
        cout << "first[" << elements[i].name << "]={";
        for (int j = 0; j < first[i].size(); j++){
            if (first[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[first[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }

    //8.求follow集合
    //将#送到开始符号
    this->follow[0].push_back(find_name("#"));
    this->create_follow_set();


    for (int i = 0; i < elements.size(); i++){

        if (elements[i].is_finally) continue;

        cout << "follow[" << elements[i].name << "]={";
        for (int j = 0; j < follow[i].size(); j++){
            if (follow[i][j] == -1) cout << "@ ";
            else
            {
                cout << elements[follow[i][j]].name << " ";
            }
        }
        cout << "}\n";
    }


    //生成DFA状态表
    this->create_dfa_states();

    //检测DFA
    for (int i = 0; i < this->states.size(); i++){

        for (int j = 0; j < states[i].projects.size(); j++){

            Project tmp = states[i].projects[j];
            cout << elements[tmp.elemKey].name << "->";
            for (int m = 0; m < elements[tmp.elemKey].expression_of_set[tmp.expressIndex].expression.size(); m++){

                if (elements[tmp.elemKey].expression_of_set[tmp.expressIndex][m] != -1){
                    cout << elements[elements[tmp.elemKey].expression_of_set[tmp.expressIndex][m]].name;
                }
                else
                {
                    cout << "@";
                }


            }
            cout << "  ProjectPoint:"<<tmp.projectPoint<<endl;

        }
        for (int j = 0; j < states[i].elementCount; j++){

            if (states[i].next[j] != -1){

                cout << elements[j].name << "--" << states[i].next[j] << "  ";
            }

        }
        cout << endl;

    }

    //创建指导动作的表
    this->create_action_table();

    //将表打印出来
    char formatS[] = "%+7s";//栈的格式
    string text="";
    char buffer[8];
    for (int i = 0; i < elements.size(); i++){
        sprintf(buffer, formatS, elements[i].name.c_str());
        text = text + buffer;
    }
    text = text + "\n";
    for (int i = 0; i < action_table.size(); i++){

        for (int j = 0; j < action_table[i].size(); j++){
            string t;
            switch (action_table[i][j].type)
            {
                case ERROR:
                    t = " ";
                    break;
                case REDUCE:
                    t = "REDUCE";
                    break;
                case SMOVE:
                    t = "SMOVE";
                    break;
                case ACC:
                    t = "ACC";
                    break;
                default:
                    break;
            }
            sprintf(buffer, formatS,t.c_str());
            text = text + buffer;
        }
        text = text + "\n";
    }
    cout << text;
}